

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::RepeatedPrimitiveFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (this->$name$_size() > 0) {\n  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n    $number$,\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n    target);\n  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(\n    _$name$_cached_byte_size_, target);\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,"for (int i = 0; i < this->$name$_size(); i++) {\n");
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "  target = ::google::protobuf::internal::WireFormatLite::\n    Write$declared_type$NoTagToArray(this->$name$(i), target);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "  target = ::google::protobuf::internal::WireFormatLite::\n    Write$declared_type$ToArray($number$, this->$name$(i), target);\n"
                      );
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n"
      "    $number$,\n"
      "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n"
      "    target);\n"
      "  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(\n"
      "    _$name$_cached_byte_size_, target);\n"
      "}\n");
  }
  printer->Print(variables_,
      "for (int i = 0; i < this->$name$_size(); i++) {\n");
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "  target = ::google::protobuf::internal::WireFormatLite::\n"
      "    Write$declared_type$NoTagToArray(this->$name$(i), target);\n");
  } else {
    printer->Print(variables_,
      "  target = ::google::protobuf::internal::WireFormatLite::\n"
      "    Write$declared_type$ToArray($number$, this->$name$(i), target);\n");
  }
  printer->Print("}\n");
}